

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRules
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this)

{
  NFRuleSet **p;
  NFRuleSet **ppNVar1;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  ppNVar1 = this->fRuleSets;
  if (ppNVar1 != (NFRuleSet **)0x0) {
    for (; *ppNVar1 != (NFRuleSet *)0x0; ppNVar1 = ppNVar1 + 1) {
      NFRuleSet::appendRules(*ppNVar1,__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getRules() const
{
    UnicodeString result;
    if (fRuleSets != NULL) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            (*p)->appendRules(result);
        }
    }
    return result;
}